

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O1

void __thiscall HFactor::~HFactor(HFactor *this)

{
  if (*(void **)(this + 0x760) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x760));
  }
  if (*(void **)(this + 0x748) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x748));
  }
  if (*(void **)(this + 0x720) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x720));
  }
  if (*(void **)(this + 0x708) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x708));
  }
  if (*(void **)(this + 0x6e8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x6e8));
  }
  if (*(void **)(this + 0x6d0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x6d0));
  }
  if (*(void **)(this + 0x6b0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x6b0));
  }
  if (*(void **)(this + 0x698) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x698));
  }
  if (*(void **)(this + 0x680) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x680));
  }
  if (*(void **)(this + 0x668) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x668));
  }
  if (*(void **)(this + 0x650) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x650));
  }
  if (*(void **)(this + 0x638) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x638));
  }
  if (*(void **)(this + 0x620) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x620));
  }
  if (*(void **)(this + 0x608) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x608));
  }
  if (*(void **)(this + 0x5f0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x5f0));
  }
  if (*(void **)(this + 0x5d8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x5d8));
  }
  if (*(void **)(this + 0x5c0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x5c0));
  }
  if (*(void **)(this + 0x5a8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x5a8));
  }
  if (*(void **)(this + 0x590) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x590));
  }
  if (*(void **)(this + 0x578) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x578));
  }
  if (*(void **)(this + 0x558) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x558));
  }
  if (*(void **)(this + 0x540) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x540));
  }
  if (*(void **)(this + 0x528) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x528));
  }
  if (*(void **)(this + 0x510) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x510));
  }
  if (*(void **)(this + 0x4f8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x4f8));
  }
  if (*(void **)(this + 0x4e0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x4e0));
  }
  if (*(void **)(this + 0x4c8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x4c8));
  }
  if (*(void **)(this + 0x4b0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x4b0));
  }
  if (*(void **)(this + 0x498) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x498));
  }
  if (*(void **)(this + 0x480) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x480));
  }
  if (*(void **)(this + 0x468) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x468));
  }
  if (*(void **)(this + 0x450) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x450));
  }
  if (*(void **)(this + 0x438) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x438));
  }
  if (*(void **)(this + 0x420) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x420));
  }
  if (*(void **)(this + 0x408) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x408));
  }
  if (*(void **)(this + 0x3f0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3f0));
  }
  if (*(void **)(this + 0x3d8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3d8));
  }
  if (*(void **)(this + 0x3c0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3c0));
  }
  if (*(void **)(this + 0x3a8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3a8));
  }
  if (*(void **)(this + 0x390) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x390));
  }
  if (*(void **)(this + 0x378) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x378));
  }
  if (*(void **)(this + 0x360) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x360));
  }
  if (*(void **)(this + 0x348) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x348));
  }
  if (*(void **)(this + 0x330) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x330));
  }
  if (*(void **)(this + 0x318) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x318));
  }
  if (*(void **)(this + 0x300) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x300));
  }
  if (*(void **)(this + 0x2e8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2e8));
  }
  if (*(void **)(this + 0x2d0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2d0));
  }
  if (*(void **)(this + 0x2b8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2b8));
  }
  if (*(void **)(this + 0x2a0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2a0));
  }
  if (*(void **)(this + 0x288) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x288));
  }
  if (*(void **)(this + 0x270) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x270));
  }
  if (*(void **)(this + 600) != (void *)0x0) {
    operator_delete(*(void **)(this + 600));
  }
  if (*(void **)(this + 0x240) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x240));
  }
  if (*(void **)(this + 0x228) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x228));
  }
  if (*(void **)(this + 0x210) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x210));
  }
  if (*(void **)(this + 0x1f8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x1f8));
  }
  if (*(void **)(this + 0x1e0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x1e0));
  }
  if (*(void **)(this + 0x1c8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x1c8));
  }
  if (*(void **)(this + 0x1b0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x1b0));
  }
  if (*(code **)(this + 0x170) != (code *)0x0) {
    (**(code **)(this + 0x170))(this + 0x160,this + 0x160,3);
  }
  if (*(void **)(this + 0x128) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x128));
  }
  *(undefined8 *)(this + 0x128) = 0;
  if (*(void **)(this + 0x98) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x98));
  }
  if (*(void **)(this + 0x80) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x80));
  }
  if (*(void **)(this + 0x68) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x68));
  }
  if (*(void **)(this + 0x48) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x48));
  }
  if (*(void **)(this + 0x30) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x30));
  }
  if (*(void **)(this + 0x18) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x18));
    return;
  }
  return;
}

Assistant:

HFactor()
      : build_realTick(0.0),
        build_synthetic_tick(0.0),
        rank_deficiency(0),
        basis_matrix_num_el(0),
        invert_num_el(0),
        kernel_dim(0),
        kernel_num_el(0),
        num_row(0),
        num_col(0),
        num_basic(0),
        a_matrix_valid(false),
        a_start(nullptr),
        a_index(nullptr),
        a_value(nullptr),
        basic_index(nullptr),
        pivot_threshold(0.0),
        pivot_tolerance(0.0),
        highs_debug_level(0),
        time_limit_(0.0),
        use_original_HFactor_logic(false),
        debug_report_(false),
        basis_matrix_limit_size(0),
        update_method(0),
        build_timer_(nullptr),
        nwork(0),
        u_merit_x(0),
        // clang-format off
        u_total_x(0) {}